

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_state.hpp
# Opt level: O1

void duckdb::QuantileOperation::
     Destroy<duckdb::QuantileState<signed_char,duckdb::QuantileStandardType>>
               (QuantileState<signed_char,_duckdb::QuantileStandardType> *state,
               AggregateInputData *param_2)

{
  _Head_base<0UL,_duckdb::QuantileCursor<signed_char>_*,_false> __ptr;
  _Head_base<0UL,_duckdb::WindowQuantileState<signed_char>_*,_false> __ptr_00;
  pointer pcVar1;
  
  __ptr._M_head_impl =
       (state->window_cursor).
       super_unique_ptr<duckdb::QuantileCursor<signed_char>,_std::default_delete<duckdb::QuantileCursor<signed_char>_>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::QuantileCursor<signed_char>,_std::default_delete<duckdb::QuantileCursor<signed_char>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::QuantileCursor<signed_char>_*,_std::default_delete<duckdb::QuantileCursor<signed_char>_>_>
       .super__Head_base<0UL,_duckdb::QuantileCursor<signed_char>_*,_false>._M_head_impl;
  if (__ptr._M_head_impl != (QuantileCursor<signed_char> *)0x0) {
    ::std::default_delete<duckdb::QuantileCursor<signed_char>_>::operator()
              ((default_delete<duckdb::QuantileCursor<signed_char>_> *)&state->window_cursor,
               __ptr._M_head_impl);
  }
  (state->window_cursor).
  super_unique_ptr<duckdb::QuantileCursor<signed_char>,_std::default_delete<duckdb::QuantileCursor<signed_char>_>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::QuantileCursor<signed_char>,_std::default_delete<duckdb::QuantileCursor<signed_char>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::QuantileCursor<signed_char>_*,_std::default_delete<duckdb::QuantileCursor<signed_char>_>_>
  .super__Head_base<0UL,_duckdb::QuantileCursor<signed_char>_*,_false>._M_head_impl =
       (QuantileCursor<signed_char> *)0x0;
  __ptr_00._M_head_impl =
       (state->window_state).
       super_unique_ptr<duckdb::WindowQuantileState<signed_char>,_std::default_delete<duckdb::WindowQuantileState<signed_char>_>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::WindowQuantileState<signed_char>,_std::default_delete<duckdb::WindowQuantileState<signed_char>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::WindowQuantileState<signed_char>_*,_std::default_delete<duckdb::WindowQuantileState<signed_char>_>_>
       .super__Head_base<0UL,_duckdb::WindowQuantileState<signed_char>_*,_false>._M_head_impl;
  if (__ptr_00._M_head_impl != (WindowQuantileState<signed_char> *)0x0) {
    ::std::default_delete<duckdb::WindowQuantileState<signed_char>_>::operator()
              ((default_delete<duckdb::WindowQuantileState<signed_char>_> *)&state->window_state,
               __ptr_00._M_head_impl);
  }
  (state->window_state).
  super_unique_ptr<duckdb::WindowQuantileState<signed_char>,_std::default_delete<duckdb::WindowQuantileState<signed_char>_>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::WindowQuantileState<signed_char>,_std::default_delete<duckdb::WindowQuantileState<signed_char>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::WindowQuantileState<signed_char>_*,_std::default_delete<duckdb::WindowQuantileState<signed_char>_>_>
  .super__Head_base<0UL,_duckdb::WindowQuantileState<signed_char>_*,_false>._M_head_impl =
       (WindowQuantileState<signed_char> *)0x0;
  pcVar1 = (state->v).super_vector<signed_char,_std::allocator<signed_char>_>.
           super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pcVar1 != (pointer)0x0) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

static void Destroy(STATE &state, AggregateInputData &) {
		state.~STATE();
	}